

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

IntRect __thiscall sf::Font::findGlyphRect(Font *this,Page *page,uint width,uint height)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  pointer pRVar6;
  ostream *poVar7;
  vector<sf::Font::Row,_std::allocator<sf::Font::Row>_> *this_00;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  uint in_stack_00000020;
  uint in_stack_00000024;
  Texture *in_stack_00000028;
  Texture newTexture;
  uint textureHeight;
  uint textureWidth;
  uint rowHeight;
  float ratio;
  iterator it;
  float bestRatio;
  Row *row;
  IntRect rect;
  Texture *in_stack_fffffffffffffee8;
  Texture *in_stack_fffffffffffffef0;
  undefined1 smooth;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar8;
  Rect<unsigned_int> local_d0;
  Row local_c0 [2];
  undefined1 local_a8 [40];
  Vector2u local_80;
  uint local_78;
  Vector2u local_74;
  uint local_6c;
  Vector2u local_68;
  Vector2u local_60;
  uint local_58;
  Vector2u local_54;
  float local_4c;
  Row *local_48;
  __normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
  local_40;
  float local_34;
  reference local_30;
  uint local_28;
  uint local_24;
  long local_20;
  IntRect local_10;
  
  local_30 = (reference)0x0;
  local_34 = 0.0;
  local_28 = in_ECX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_40._M_current =
       (Row *)std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::begin
                        ((vector<sf::Font::Row,_std::allocator<sf::Font::Row>_> *)
                         in_stack_fffffffffffffee8);
  while( true ) {
    local_48 = (Row *)std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::end
                                ((vector<sf::Font::Row,_std::allocator<sf::Font::Row>_> *)
                                 in_stack_fffffffffffffee8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1 || local_30 != (reference)0x0) break;
    uVar5 = (ulong)local_28;
    pRVar6 = __gnu_cxx::
             __normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
             ::operator->(&local_40);
    uVar8 = local_24;
    local_4c = (float)uVar5 / (float)pRVar6->height;
    if ((0.7 <= local_4c) && (local_4c <= 1.0)) {
      local_54 = Texture::getSize((Texture *)(local_20 + 0x30));
      uVar3 = local_54.x;
      pRVar6 = __gnu_cxx::
               __normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
               ::operator->(&local_40);
      if ((uVar8 <= uVar3 - pRVar6->width) && (local_34 <= local_4c)) {
        local_30 = __gnu_cxx::
                   __normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
                   ::operator*(&local_40);
        local_34 = local_4c;
      }
    }
    __gnu_cxx::
    __normal_iterator<sf::Font::Row_*,_std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>_>
    ::operator++(&local_40);
  }
  if (local_30 == (reference)0x0) {
    local_58 = local_28 + local_28 / 10;
    uVar8 = local_28;
    while( true ) {
      uVar2 = *(int *)(local_20 + 0x58) + local_58;
      local_60 = Texture::getSize((Texture *)(local_20 + 0x30));
      uVar3 = local_24;
      in_stack_ffffffffffffff10 = CONCAT13(1,(int3)in_stack_ffffffffffffff10);
      if (uVar2 < local_60.y) {
        local_68 = Texture::getSize((Texture *)(local_20 + 0x30));
        in_stack_ffffffffffffff10 = CONCAT13(local_68.x <= uVar3,(int3)in_stack_ffffffffffffff10);
      }
      if ((char)((uint)in_stack_ffffffffffffff10 >> 0x18) == '\0') {
        this_00 = (vector<sf::Font::Row,_std::allocator<sf::Font::Row>_> *)(local_20 + 0x60);
        Row::Row(local_c0,*(uint *)(local_20 + 0x58),local_58);
        std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::push_back
                  (this_00,(value_type *)in_stack_fffffffffffffee8);
        *(uint *)(local_20 + 0x58) = local_58 + *(int *)(local_20 + 0x58);
        local_30 = std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::back(this_00);
        goto LAB_001e0555;
      }
      local_74 = Texture::getSize((Texture *)(local_20 + 0x30));
      local_6c = local_74.x;
      local_80 = Texture::getSize((Texture *)(local_20 + 0x30));
      local_78 = local_80.y;
      uVar3 = local_6c << 1;
      uVar2 = Texture::getMaximumSize();
      if (uVar2 < uVar3) break;
      uVar2 = local_78 << 1;
      uVar4 = Texture::getMaximumSize();
      if (uVar4 < uVar2) break;
      smooth = (undefined1)((ulong)local_a8 >> 0x38);
      Texture::Texture((Texture *)CONCAT44(uVar8,in_stack_ffffffffffffff10));
      Texture::create(in_stack_00000028,in_stack_00000024,in_stack_00000020);
      Texture::setSmooth((Texture *)CONCAT44(uVar3,uVar2),(bool)smooth);
      Texture::update(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      Texture::swap(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      Texture::~Texture(in_stack_fffffffffffffef0);
    }
    poVar7 = err();
    poVar7 = std::operator<<(poVar7,
                             "Failed to add a new character to the font: the maximum texture size has been reached"
                            );
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    Rect<int>::Rect(&local_10,0,0,2,2);
  }
  else {
LAB_001e0555:
    Rect<unsigned_int>::Rect(&local_d0,local_30->width,local_30->top,local_24,local_28);
    Rect<int>::Rect<unsigned_int>(&local_10,&local_d0);
    local_30->width = local_24 + local_30->width;
  }
  return local_10;
}

Assistant:

IntRect Font::findGlyphRect(Page& page, unsigned int width, unsigned int height) const
{
    // Find the line that fits well the glyph
    Row* row = NULL;
    float bestRatio = 0;
    for (std::vector<Row>::iterator it = page.rows.begin(); it != page.rows.end() && !row; ++it)
    {
        float ratio = static_cast<float>(height) / static_cast<float>(it->height);

        // Ignore rows that are either too small or too high
        if ((ratio < 0.7f) || (ratio > 1.f))
            continue;

        // Check if there's enough horizontal space left in the row
        if (width > page.texture.getSize().x - it->width)
            continue;

        // Make sure that this new row is the best found so far
        if (ratio < bestRatio)
            continue;

        // The current row passed all the tests: we can select it
        row = &*it;
        bestRatio = ratio;
    }

    // If we didn't find a matching row, create a new one (10% taller than the glyph)
    if (!row)
    {
        unsigned int rowHeight = height + height / 10;
        while ((page.nextRow + rowHeight >= page.texture.getSize().y) || (width >= page.texture.getSize().x))
        {
            // Not enough space: resize the texture if possible
            unsigned int textureWidth  = page.texture.getSize().x;
            unsigned int textureHeight = page.texture.getSize().y;
            if ((textureWidth * 2 <= Texture::getMaximumSize()) && (textureHeight * 2 <= Texture::getMaximumSize()))
            {
                // Make the texture 2 times bigger
                Texture newTexture;
                newTexture.create(textureWidth * 2, textureHeight * 2);
                newTexture.setSmooth(m_isSmooth);
                newTexture.update(page.texture);
                page.texture.swap(newTexture);
            }
            else
            {
                // Oops, we've reached the maximum texture size...
                err() << "Failed to add a new character to the font: the maximum texture size has been reached" << std::endl;
                return IntRect(0, 0, 2, 2);
            }
        }

        // We can now create the new row
        page.rows.push_back(Row(page.nextRow, rowHeight));
        page.nextRow += rowHeight;
        row = &page.rows.back();
    }

    // Find the glyph's rectangle on the selected row
    IntRect rect(Rect<unsigned int>(row->width, row->top, width, height));

    // Update the row informations
    row->width += width;

    return rect;
}